

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall
asmjit::ZoneVectorBase::_resize(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  Error EVar1;
  ulong in_RCX;
  ZoneHeap *in_RDX;
  ZoneVectorBase *in_RSI;
  long *in_RDI;
  Error _err;
  size_t length;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  size_t n_00;
  
  n_00 = in_RDI[1];
  if ((ulong)in_RDI[2] < in_RCX) {
    EVar1 = _grow(in_RSI,in_RDX,in_RCX,n_00);
    if (EVar1 != 0) {
      return EVar1;
    }
    if ((ulong)in_RDI[2] < in_RCX) {
      DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
    }
  }
  if (n_00 < in_RCX) {
    memset((void *)(*in_RDI + n_00 * (long)in_RDX),0,(in_RCX - n_00) * (long)in_RDX);
  }
  in_RDI[1] = in_RCX;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t length = _length;
  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(heap, sizeOfT, n - length));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (length < n)
    ::memset(static_cast<uint8_t*>(_data) + length * sizeOfT, 0, (n - length) * sizeOfT);

  _length = n;
  return kErrorOk;
}